

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io-window.cc
# Opt level: O0

void (anonymous_namespace)::
     TextCgbPal<(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg>
               (Emulator *e,char *name,CgbSwatchArg args,CgbSwatchArg args_1,CgbSwatchArg args_2,
               CgbSwatchArg args_3)

{
  char local_6f [7];
  u8 v;
  char buf [15];
  ImVec4 kRegColor;
  char *name_local;
  Emulator *e_local;
  CgbSwatchArg args_local_1;
  CgbSwatchArg args_local;
  
  ImVec4::ImVec4((ImVec4 *)(buf + 7),1.0,0.75,0.3,1.0);
  snprintf(local_6f,0xf,"[%s]",name);
  ImGui::Text("   %8s:   ",local_6f);
  ImGui::SameLine(0.0,-1.0);
  TextRegBits<(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg>
            (e,0xe4,args,args_1,args_2,args_3);
  return;
}

Assistant:

void TextCgbPal(Emulator* e, const char* name, Args... args) {
  const ImVec4 kRegColor(1.f, 0.75f, 0.3f, 1.f);

  char buf[15];
  u8 v = 0xE4; // Always use normal order.
  snprintf(buf, sizeof(buf), "[%s]", name);
  ImGui::Text("   %8s:   ", buf);
  ImGui::SameLine();
  TextRegBits(e, v, args...);
}